

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
          (SACSubcaseBase *this,GLuint size,GLuint *values,GLuint min_value)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  ulong uVar6;
  
  puVar4 = (uint *)CONCAT44(in_register_00000034,size);
  uVar5 = (ulong)this & 0xffffffff;
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(puVar4,puVar4 + uVar5);
  uVar6 = ((ulong)values & 0xffffffff) - 1;
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (-lVar3 == uVar5) goto LAB_00996b83;
    anon_unknown_0::Output("%u\n",(ulong)*puVar4);
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
    uVar6 = uVar6 + 1;
    lVar2 = lVar3 + -1;
  } while (uVar6 == uVar1);
  anon_unknown_0::Output("Counter value is %u should be %u.\n",(ulong)uVar1,uVar6 & 0xffffffff);
LAB_00996b83:
  return uVar5 <= (ulong)-lVar3;
}

Assistant:

bool CheckCounterValues(GLuint size, GLuint* values, GLuint min_value)
	{
		std::sort(values, values + size);
		for (GLuint i = 0; i < size; ++i)
		{
			Output("%u\n", values[i]);
			if (values[i] != i + min_value)
			{
				Output("Counter value is %u should be %u.\n", values[i], i + min_value);
				return false;
			}
		}
		return true;
	}